

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_clampVecScalarScalar_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int i_1;
  undefined8 local_48;
  float local_40;
  float local_3c;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> res_1;
  Vector<float,_4> res_2;
  
  local_48 = *(undefined8 *)(c->in[0].m_data + 1);
  local_40 = c->in[0].m_data[3];
  local_3c = c->in[0].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] = (uint)(long)*(float *)((long)&local_48 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[2].m_data[1];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar5 = 0;
  do {
    uVar3 = res.m_data[lVar5];
    uVar6 = (uint)(long)fVar2;
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    uVar4 = (uint)(long)fVar1;
    if (uVar3 < uVar4) {
      uVar6 = uVar4;
    }
    res_1.m_data[lVar5] = uVar6;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar5 = 0;
  do {
    res_2.m_data[lVar5] = (float)res_1.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  *(undefined8 *)(c->color).m_data = res_2.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_2.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }